

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idamax.c
# Opt level: O2

integer idamax_(integer *n,doublereal *dx,integer *incx)

{
  double dVar1;
  uint uVar2;
  uint uVar3;
  integer iVar4;
  ulong uVar5;
  double *pdVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  double dVar10;
  
  uVar2 = *n;
  iVar4 = 0;
  if (0 < (int)uVar2) {
    uVar3 = *incx;
    if (0 < (int)uVar3) {
      if (uVar2 == 1) {
        iVar4 = 1;
      }
      else {
        dVar10 = *dx;
        uVar8 = -(ulong)(dVar10 < -dVar10);
        dVar10 = (double)(~uVar8 & (ulong)dVar10 | (ulong)-dVar10 & uVar8);
        if (uVar3 == 1) {
          uVar8 = 1;
          for (uVar5 = 2; iVar4 = (integer)uVar8, (ulong)uVar2 + 1 != uVar5; uVar5 = uVar5 + 1) {
            dVar1 = dx[uVar5 - 1];
            uVar9 = -(ulong)(-dVar1 <= dVar1);
            dVar1 = (double)(~uVar9 & (ulong)-dVar1 | (ulong)dVar1 & uVar9);
            if (dVar10 < dVar1) {
              uVar8 = uVar5;
            }
            uVar8 = uVar8 & 0xffffffff;
            dVar10 = (double)(~-(ulong)(dVar10 < dVar1) & (ulong)dVar10 |
                             -(ulong)(dVar10 < dVar1) & (ulong)dVar1);
          }
        }
        else {
          pdVar6 = dx + uVar3;
          iVar4 = 1;
          for (iVar7 = 2; iVar7 - uVar2 != 1; iVar7 = iVar7 + 1) {
            dVar1 = *pdVar6;
            uVar8 = -(ulong)(-dVar1 <= dVar1);
            dVar1 = (double)(~uVar8 & (ulong)-dVar1 | (ulong)dVar1 & uVar8);
            if (dVar10 < dVar1) {
              iVar4 = iVar7;
            }
            dVar10 = (double)(~-(ulong)(dVar10 < dVar1) & (ulong)dVar10 |
                             -(ulong)(dVar10 < dVar1) & (ulong)dVar1);
            pdVar6 = pdVar6 + uVar3;
          }
        }
      }
    }
  }
  return iVar4;
}

Assistant:

integer idamax_(integer *n, doublereal *dx, integer *incx)
{


    /* System generated locals */
integer ret_val, i__1;
    doublereal d__1;

    /* Local variables */
    doublereal dmax__;
    integer i, ix;


/*     finds the index of element having max. absolute value.   
       jack dongarra, linpack, 3/11/78.   
       modified 3/93 to return if incx .le. 0.   
       modified 12/3/93, array(1) declarations changed to array(*)   


    
   Parameter adjustments   
       Function Body */
#define DX(I) dx[(I)-1]


    ret_val = 0;
    if (*n < 1 || *incx <= 0) {
	return ret_val;
    }
    ret_val = 1;
    if (*n == 1) {
	return ret_val;
    }
    if (*incx == 1) {
	goto L20;
    }

/*        code for increment not equal to 1 */

    ix = 1;
    dmax__ = abs(DX(1));
    ix += *incx;
    for (i = 2; i <= *n; ++i) {
	if ((d__1 = DX(ix), abs(d__1)) <= dmax__) {
	    goto L5;
	}
	ret_val = i;
	dmax__ = (d__1 = DX(ix), abs(d__1));
L5:
	ix += *incx;
/* L10: */
    }
    return ret_val;

/*        code for increment equal to 1 */

L20:
    dmax__ = abs(DX(1));
    for (i = 2; i <= *n; ++i) {
	if ((d__1 = DX(i), abs(d__1)) <= dmax__) {
	    goto L30;
	}
	ret_val = i;
	dmax__ = (d__1 = DX(i), abs(d__1));
L30:
	;
    }
    return ret_val;
}